

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

error_code llvm::errorToErrorCode(Error *Err)

{
  long *plVar1;
  _Alloc_hider _Var2;
  int iVar3;
  ulong uVar4;
  ErrorList *List;
  long *plVar5;
  ErrorInfoBase *pEVar6;
  long *plVar7;
  error_code eVar8;
  error_code EC;
  ErrorInfoBase *local_88;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_80;
  anon_class_8_1_3fcf615c local_78;
  Error local_70;
  ulong local_68;
  string local_60;
  error_code local_40;
  
  local_40._M_value = 0;
  local_40._M_cat = (error_category *)std::_V2::system_category();
  pEVar6 = Err->Payload;
  Err->Payload = (ErrorInfoBase *)0x0;
  plVar5 = (long *)((ulong)pEVar6 & 0xfffffffffffffffe);
  local_78.EC = &local_40;
  if (plVar5 == (long *)0x0) {
    local_88 = (ErrorInfoBase *)0x0;
  }
  else {
    iVar3 = (**(code **)(*plVar5 + 0x30))(plVar5,&ErrorList::ID);
    if ((char)iVar3 == '\0') {
      local_60._M_dataplus._M_p = (pointer)plVar5;
      handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
                ((llvm *)&local_88,
                 (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                 &local_60,&local_78);
      if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
      local_60._M_dataplus._M_p = (pointer)0x0;
      plVar5 = (long *)0x0;
      pEVar6 = local_88;
    }
    else {
      local_88 = (ErrorInfoBase *)0x1;
      plVar7 = (long *)plVar5[1];
      plVar1 = (long *)plVar5[2];
      pEVar6 = (ErrorInfoBase *)0x1;
      if (plVar7 != plVar1) {
        do {
          local_80._M_head_impl = (ErrorInfoBase *)*plVar7;
          *plVar7 = 0;
          local_70.Payload = pEVar6;
          handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
                    ((llvm *)&local_68,
                     (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                     &local_80,&local_78);
          ErrorList::join((ErrorList *)&local_60,&local_70,(Error *)&local_68);
          _Var2._M_p = local_60._M_dataplus._M_p;
          local_60._M_dataplus._M_p = (pointer)0x0;
          if ((long *)(local_68 & 0xfffffffffffffffe) != (long *)0x0) {
            (**(code **)(*(long *)(local_68 & 0xfffffffffffffffe) + 8))();
          }
          if (local_80._M_head_impl != (ErrorInfoBase *)0x0) {
            (*(local_80._M_head_impl)->_vptr_ErrorInfoBase[1])();
          }
          local_80._M_head_impl = (ErrorInfoBase *)0x0;
          if ((long *)((ulong)local_70.Payload & 0xfffffffffffffffe) != (long *)0x0) {
            (**(code **)(*(long *)((ulong)local_70.Payload & 0xfffffffffffffffe) + 8))();
          }
          pEVar6 = (ErrorInfoBase *)((ulong)_Var2._M_p | 1);
          plVar7 = plVar7 + 1;
        } while (plVar7 != plVar1);
      }
    }
    local_88 = pEVar6;
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 8))(plVar5);
    }
  }
  uVar4 = (ulong)local_88 & 0xfffffffffffffffe;
  local_88 = (ErrorInfoBase *)(uVar4 != 0 | uVar4);
  if (uVar4 != 0) {
    llvm_unreachable_internal
              ("Failure value returned from cantFail wrapped call",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Error.h"
               ,0x2be);
  }
  if (ErrorErrorCat.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              (&ErrorErrorCat.super_ManagedStaticBase,
               object_creator<(anonymous_namespace)::ErrorErrorCategory>::call,
               object_deleter<(anonymous_namespace)::ErrorErrorCategory>::call);
  }
  eVar8._4_4_ = 0;
  eVar8._M_value = local_40._M_value;
  if (local_40._M_value == 2 &&
      (__base_type)local_40._M_cat == ErrorErrorCat.super_ManagedStaticBase.Ptr._M_b._M_p) {
    (**(code **)(*(long *)local_40._M_cat + 0x20))(&local_60,local_40._M_cat,local_40._M_value);
    report_fatal_error(&local_60,true);
  }
  eVar8._M_cat = local_40._M_cat;
  return eVar8;
}

Assistant:

std::error_code errorToErrorCode(Error Err) {
  std::error_code EC;
  handleAllErrors(std::move(Err), [&](const ErrorInfoBase &EI) {
    EC = EI.convertToErrorCode();
  });
  if (EC == inconvertibleErrorCode())
    report_fatal_error(EC.message());
  return EC;
}